

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masterserver.cpp
# Opt level: O1

int __thiscall CMasterServer::RefreshAddresses(CMasterServer *this,int Nettype)

{
  CMasterInfo *pCVar1;
  CHostLookup *pCVar2;
  long lVar3;
  
  if ((this->m_State & 0xfffffffdU) == 0) {
    dbg_msg("engine/mastersrv","refreshing master server addresses");
    pCVar1 = this->m_aMasterServers;
    lVar3 = 4;
    do {
      pCVar2 = &pCVar1->m_Lookup;
      (*(this->m_pEngine->super_IInterface)._vptr_IInterface[6])
                (this->m_pEngine,pCVar2,(long)(pCVar2 + -1) + 0x28,Nettype);
      *(undefined1 *)((long)(pCVar2 + -1) + 0xc0) = 0;
      pCVar1 = (CMasterInfo *)(pCVar2 + 1);
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    this->m_State = 1;
    return 0;
  }
  return -1;
}

Assistant:

virtual int RefreshAddresses(int Nettype)
	{
		if(m_State != STATE_INIT && m_State != STATE_READY)
			return -1;

		dbg_msg("engine/mastersrv", "refreshing master server addresses");

		// add lookup jobs
		for(int i = 0; i < MAX_MASTERSERVERS; i++)
		{
			m_pEngine->HostLookup(&m_aMasterServers[i].m_Lookup, m_aMasterServers[i].m_aHostname, Nettype);
			m_aMasterServers[i].m_Valid = false;
		}

		m_State = STATE_UPDATE;
		return 0;
	}